

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int nonce_function_rfc6979
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  undefined8 uVar1;
  int i;
  uint uVar2;
  long lVar3;
  uint uVar4;
  size_t extraout_RDX;
  size_t outlen;
  size_t extraout_RDX_00;
  unsigned_long _zzq_result;
  uchar keydata [112];
  secp256k1_rfc6979_hmac_sha256 rng;
  unsigned_long _zzq_args [6];
  undefined8 local_128 [5];
  undefined4 uStack_100;
  undefined4 local_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  uint local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  secp256k1_rfc6979_hmac_sha256 local_b8 [2];
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    uVar4 = (uint)msg32[lVar3] | uVar2 << 8;
    uVar2 = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
    if (uVar4 < 0xd) {
      uVar2 = uVar4;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar2);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar2);
  uStack_f8 = 0;
  uStack_f4 = 0;
  uStack_f0 = 0;
  local_128[4] = 0;
  uStack_100 = 0;
  local_fc = 0;
  local_128[0] = *(undefined8 *)key32;
  local_128[1] = *(undefined8 *)(key32 + 8);
  local_128[2] = *(undefined8 *)(key32 + 0x10);
  local_128[3] = *(undefined8 *)(key32 + 0x18);
  local_ec = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if (data == (void *)0x0) {
    uVar2 = 0x40;
  }
  else {
    local_e8 = *data;
    uStack_e0 = *(undefined8 *)((long)data + 8);
    local_d8 = *(undefined8 *)((long)data + 0x10);
    uStack_d0 = *(undefined8 *)((long)data + 0x18);
    uVar2 = 0x60;
  }
  if (algo16 != (uchar *)0x0) {
    uVar1 = *(undefined8 *)(algo16 + 8);
    *(undefined8 *)((long)local_128 + (ulong)uVar2) = *(undefined8 *)algo16;
    *(undefined8 *)((long)local_128 + (ulong)uVar2 + 8) = uVar1;
    uVar2 = uVar2 | 0x10;
  }
  secp256k1_rfc6979_hmac_sha256_initialize(local_b8,(uchar *)local_128,(ulong)uVar2);
  uVar2 = 0;
  outlen = extraout_RDX;
  do {
    secp256k1_rfc6979_hmac_sha256_generate(local_b8,nonce32,outlen);
    uVar2 = uVar2 + 1;
    outlen = extraout_RDX_00;
  } while (uVar2 <= counter);
  return 1;
}

Assistant:

static int nonce_function_rfc6979(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
   unsigned char keydata[112];
   unsigned int offset = 0;
   secp256k1_rfc6979_hmac_sha256 rng;
   unsigned int i;
   secp256k1_scalar msg;
   unsigned char msgmod32[32];
   secp256k1_scalar_set_b32(&msg, msg32, NULL);
   secp256k1_scalar_get_b32(msgmod32, &msg);
   /* We feed a byte array to the PRNG as input, consisting of:
    * - the private key (32 bytes) and reduced message (32 bytes), see RFC 6979 3.2d.
    * - optionally 32 extra bytes of data, see RFC 6979 3.6 Additional Data.
    * - optionally 16 extra bytes with the algorithm name.
    * Because the arguments have distinct fixed lengths it is not possible for
    *  different argument mixtures to emulate each other and result in the same
    *  nonces.
    */
   buffer_append(keydata, &offset, key32, 32);
   buffer_append(keydata, &offset, msgmod32, 32);
   if (data != NULL) {
       buffer_append(keydata, &offset, data, 32);
   }
   if (algo16 != NULL) {
       buffer_append(keydata, &offset, algo16, 16);
   }
   secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, offset);
   for (i = 0; i <= counter; i++) {
       secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
   }
   secp256k1_rfc6979_hmac_sha256_finalize(&rng);

   secp256k1_memclear(keydata, sizeof(keydata));
   secp256k1_rfc6979_hmac_sha256_clear(&rng);
   return 1;
}